

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O2

void Acec_InsertHadd(Gia_Man_t *pNew,int *In,int *Out)

{
  int iVar1;
  int iLit1;
  
  iVar1 = Gia_ManAppendAnd2(pNew,*In,In[1]);
  Out[1] = iVar1;
  iVar1 = Abc_LitNot(*In);
  iLit1 = Abc_LitNot(In[1]);
  iVar1 = Gia_ManAppendAnd2(pNew,iVar1,iLit1);
  iVar1 = Gia_ManAppendOr2(pNew,Out[1],iVar1);
  iVar1 = Abc_LitNot(iVar1);
  *Out = iVar1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acec_InsertHadd( Gia_Man_t * pNew, int In[2], int Out[2] )
{
    int And, Or;
    Out[1] = Gia_ManAppendAnd2( pNew, In[0], In[1] );
    And    = Gia_ManAppendAnd2( pNew, Abc_LitNot(In[0]), Abc_LitNot(In[1]) );
    Or     = Gia_ManAppendOr2( pNew, Out[1], And );
    Out[0] = Abc_LitNot( Or );
}